

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O3

void Fraig_CollectSupergate_rec
               (Fraig_Node_t *pNode,Fraig_NodeVec_t *vSuper,int fFirst,int fStopAtMux)

{
  int iVar1;
  Fraig_Node_t *pFVar2;
  bool bVar3;
  
  bVar3 = fFirst == 0;
  pFVar2 = pNode;
  do {
    if (bVar3) {
      if ((((ulong)pNode & 1) != 0) || (1 < *(int *)(((ulong)pNode & 0xfffffffffffffffe) + 0xc)))
      goto LAB_00690287;
    }
    else if (((ulong)pNode & 1) != 0) {
LAB_00690287:
      Fraig_NodeVecPushUnique(vSuper,pNode);
      return;
    }
    iVar1 = Fraig_NodeIsVar(pNode);
    if (iVar1 != 0) goto LAB_00690287;
    if (fStopAtMux == 0) {
      fStopAtMux = 0;
      Fraig_CollectSupergate_rec(pFVar2->p1,vSuper,0,0);
      pNode = pFVar2->p2;
      bVar3 = true;
      pFVar2 = pNode;
    }
    else {
      iVar1 = Fraig_NodeIsMuxType(pNode);
      if (iVar1 != 0) goto LAB_00690287;
      Fraig_CollectSupergate_rec(pNode->p1,vSuper,0,fStopAtMux);
      pNode = pNode->p2;
      bVar3 = true;
    }
  } while( true );
}

Assistant:

void Fraig_CollectSupergate_rec( Fraig_Node_t * pNode, Fraig_NodeVec_t * vSuper, int fFirst, int fStopAtMux )
{
    // if the new node is complemented or a PI, another gate begins
//    if ( Fraig_IsComplement(pNode) || Fraig_NodeIsVar(pNode) || Fraig_NodeIsMuxType(pNode) )
    if ( (!fFirst && Fraig_Regular(pNode)->nRefs > 1) || 
          Fraig_IsComplement(pNode) || Fraig_NodeIsVar(pNode) || 
          (fStopAtMux && Fraig_NodeIsMuxType(pNode)) )
    {
        Fraig_NodeVecPushUnique( vSuper, pNode );
        return;
    }
    // go through the branches
    Fraig_CollectSupergate_rec( pNode->p1, vSuper, 0, fStopAtMux );
    Fraig_CollectSupergate_rec( pNode->p2, vSuper, 0, fStopAtMux );
}